

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heapmap.cpp
# Opt level: O2

void test4(void)

{
  HeapMap<LinkedNode,_LinkedNode,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>
  *this;
  LinkedNode *k;
  LinkedNode *val;
  ostream *poVar1;
  void *local_40;
  int local_38;
  int local_34;
  
  this = TinyGC::
         MakeGarbageCollected<HeapMap<LinkedNode,LinkedNode,std::integral_constant<bool,true>,std::integral_constant<bool,true>>>
                   (tg);
  for (local_34 = 0; local_34 < 10; local_34 = local_34 + 1) {
    local_40 = (void *)0x0;
    k = TinyGC::MakeGarbageCollected<LinkedNode,decltype(nullptr),int&>(tg,&local_40,&local_34);
    local_40 = (void *)0x0;
    local_38 = local_34 + 100;
    val = TinyGC::MakeGarbageCollected<LinkedNode,decltype(nullptr),int>(tg,&local_40,&local_38);
    HeapMap<LinkedNode,_LinkedNode,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>
    ::insert(this,k,val);
    HeapMap<LinkedNode,_LinkedNode,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>
    ::at(this,k);
    poVar1 = std::ostream::_M_insert<void_const*>(&std::cout);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  return;
}

Assistant:

void test4() {
  HeapMap<LinkedNode, LinkedNode> *p =
      MakeGarbageCollected<HeapMap<LinkedNode, LinkedNode>>();
  for (int id = 0; id < 10; id++) {
    auto t1 = MakeGarbageCollected<LinkedNode>(nullptr, id);
    auto t2 = MakeGarbageCollected<LinkedNode>(nullptr, id + 100);

    p->insert(t1, t2);
    // p->erase(t1);
    std::cout << p->at(t1) << std::endl;
  }
}